

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.cpp
# Opt level: O1

void __thiscall DragonParser::LexerNamespace::Word::~Word(Word *this)

{
  pointer pcVar1;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_0010ab10;
  (this->lexme)._M_string_length = 0;
  *(this->lexme)._M_dataplus._M_p = '\0';
  pcVar1 = (this->lexme)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->lexme).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

Word::~Word()
    {
        Token::~Token();
        lexme.clear();
    }